

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O1

void __thiscall
VmaPoolAllocator<VmaBlockMetadata_TLSF::Block>::Free
          (VmaPoolAllocator<VmaBlockMetadata_TLSF::Block> *this,Block *ptr)

{
  Item *pIVar1;
  uint32_t *puVar2;
  size_t sVar3;
  
  sVar3 = (this->m_ItemBlocks).m_Count;
  if (sVar3 != 0) {
    puVar2 = &(this->m_ItemBlocks).m_pArray[sVar3 - 1].FirstFreeIndex;
    do {
      pIVar1 = ((ItemBlock *)(puVar2 + -3))->pItems;
      if ((pIVar1 <= ptr) && (ptr < pIVar1 + puVar2[-1])) {
        *(uint32_t *)&ptr->offset = *puVar2;
        *puVar2 = (int)((ulong)((long)ptr - (long)pIVar1) >> 4) * -0x55555555;
        return;
      }
      sVar3 = sVar3 - 1;
      puVar2 = puVar2 + -4;
    } while (sVar3 != 0);
  }
  return;
}

Assistant:

size_t size() const { return m_Count; }